

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float32 float16_to_float32_ppc(float16 a,_Bool ieee,float_status *s)

{
  float32 fVar1;
  FloatFmt *params;
  undefined7 in_register_00000031;
  FloatParts FVar2;
  
  params = &float16_params_ahp;
  if ((int)CONCAT71(in_register_00000031,ieee) != 0) {
    params = &float16_params;
  }
  FVar2 = float16a_unpack_canonical(a,s,params);
  FVar2 = float_to_float(FVar2,&float32_params,s);
  fVar1 = float32_round_pack_canonical(FVar2,s);
  return fVar1;
}

Assistant:

float32 float16_to_float32(float16 a, bool ieee, float_status *s)
{
    const FloatFmt *fmt16 = ieee ? &float16_params : &float16_params_ahp;
    FloatParts p = float16a_unpack_canonical(a, s, fmt16);
    FloatParts pr = float_to_float(p, &float32_params, s);
    return float32_round_pack_canonical(pr, s);
}